

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i alVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  longlong lVar31;
  longlong lVar32;
  uint uVar33;
  int iVar34;
  parasail_result_t *ppVar35;
  __m256i *ptr;
  __m256i *palVar36;
  __m256i *ptr_00;
  int8_t *ptr_01;
  int iVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  long lVar41;
  ulong size;
  __m256i *palVar42;
  __m256i *palVar43;
  long lVar44;
  int iVar45;
  char cVar46;
  uint uVar47;
  ulong uVar48;
  char cVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 local_248 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_f8 [32];
  undefined1 auVar79 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_avx2_256_8_cold_1();
        }
        else {
          uVar33 = uVar2 - 1;
          size = (ulong)uVar2 + 0x1f >> 5;
          uVar6 = (ulong)uVar33 % size;
          iVar34 = (int)(uVar33 / size);
          iVar37 = ppVar4->min;
          local_158._4_4_ = -open;
          uVar47 = (uint)(byte)-(char)iVar37;
          if (iVar37 != local_158._4_4_ && SBORROW4(iVar37,local_158._4_4_) == iVar37 + open < 0) {
            uVar47 = open;
          }
          cVar49 = '~' - (char)ppVar4->max;
          ppVar35 = parasail_result_new_rowcol1((uint)((ulong)uVar2 + 0x1f) & 0x7fffffe0,s2Len);
          if (ppVar35 != (parasail_result_t *)0x0) {
            ppVar35->flag = ppVar35->flag | 0x20140801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar36 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar36 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar37 = s2Len + -1;
              uVar50 = (undefined1)open;
              uVar51 = (undefined1)gap;
              auVar54[1] = uVar51;
              auVar54[0] = uVar51;
              auVar54[2] = uVar51;
              auVar54[3] = uVar51;
              auVar54[4] = uVar51;
              auVar54[5] = uVar51;
              auVar54[6] = uVar51;
              auVar54[7] = uVar51;
              auVar54[8] = uVar51;
              auVar54[9] = uVar51;
              auVar54[10] = uVar51;
              auVar54[0xb] = uVar51;
              auVar54[0xc] = uVar51;
              auVar54[0xd] = uVar51;
              auVar54[0xe] = uVar51;
              auVar54[0xf] = uVar51;
              auVar54[0x10] = uVar51;
              auVar54[0x11] = uVar51;
              auVar54[0x12] = uVar51;
              auVar54[0x13] = uVar51;
              auVar54[0x14] = uVar51;
              auVar54[0x15] = uVar51;
              auVar54[0x16] = uVar51;
              auVar54[0x17] = uVar51;
              auVar54[0x18] = uVar51;
              auVar54[0x19] = uVar51;
              auVar54[0x1a] = uVar51;
              auVar54[0x1b] = uVar51;
              auVar54[0x1c] = uVar51;
              auVar54[0x1d] = uVar51;
              auVar54[0x1e] = uVar51;
              auVar54[0x1f] = uVar51;
              cVar46 = (char)uVar47 + -0x7f;
              auVar53._4_4_ = 0;
              auVar53._0_4_ = open;
              auVar52._4_4_ = 0;
              auVar52._0_4_ = gap;
              local_f8._8_8_ = SEXT48((int)local_158._4_4_);
              auVar52._8_4_ = gap;
              auVar52._12_4_ = 0;
              auVar52._16_4_ = gap;
              auVar52._20_4_ = 0;
              auVar52._24_4_ = gap;
              auVar52._28_4_ = 0;
              local_f8._0_8_ = local_f8._8_8_;
              local_f8._16_8_ = local_f8._8_8_;
              local_f8._24_8_ = local_f8._8_8_;
              auVar64._8_8_ = size;
              auVar64._0_8_ = size;
              auVar64._16_8_ = size;
              auVar64._24_8_ = size;
              auVar9 = vpmuldq_avx2(auVar64,_DAT_00908f20);
              auVar10 = vpmuldq_avx2(auVar64,_DAT_00908f40);
              auVar11 = vpmuldq_avx2(auVar64,_DAT_00908f60);
              auVar57 = vpmuldq_avx2(auVar64,_DAT_00908f80);
              auVar66 = vpmuldq_avx2(auVar64,_DAT_00908e00);
              auVar67 = vpmuldq_avx2(auVar64,_DAT_00908e20);
              auVar58 = vpmuldq_avx2(auVar64,_DAT_00908c60);
              auVar64 = vpmuldq_avx2(auVar64,_DAT_00908b60);
              auVar53._8_4_ = open;
              auVar53._12_4_ = 0;
              auVar53._16_4_ = open;
              auVar53._20_4_ = 0;
              auVar53._24_4_ = open;
              auVar53._28_4_ = 0;
              uVar39 = 0;
              auVar76._8_8_ = 0xffffffffffffff80;
              auVar76._0_8_ = 0xffffffffffffff80;
              auVar76._16_8_ = 0xffffffffffffff80;
              auVar76._24_8_ = 0xffffffffffffff80;
              auVar78._8_8_ = 0xff;
              auVar78._0_8_ = 0xff;
              auVar78._16_8_ = 0xff;
              auVar78._24_8_ = 0xff;
              palVar42 = ptr;
              palVar43 = ptr_00;
              do {
                auVar65._8_8_ = uVar39;
                auVar65._0_8_ = uVar39;
                auVar65._16_8_ = uVar39;
                auVar65._24_8_ = uVar39;
                auVar56 = vpaddq_avx2(auVar65,auVar58);
                auVar68 = vpaddq_avx2(auVar65,auVar64);
                auVar69 = vpaddq_avx2(auVar65,auVar67);
                auVar70 = vpaddq_avx2(auVar65,auVar66);
                auVar71 = vpaddq_avx2(auVar65,auVar57);
                auVar73 = vpaddq_avx2(auVar65,auVar11);
                auVar74 = vpaddq_avx2(auVar65,auVar10);
                auVar65 = vpaddq_avx2(auVar65,auVar9);
                auVar12 = vpmuludq_avx2(auVar65,auVar52);
                auVar65 = vpsrlq_avx2(auVar65,0x20);
                auVar65 = vpmuludq_avx2(auVar65,auVar52);
                auVar65 = vpsllq_avx2(auVar65,0x20);
                auVar65 = vpaddq_avx2(auVar12,auVar65);
                auVar12 = vpmuludq_avx2(auVar74,auVar52);
                auVar74 = vpsrlq_avx2(auVar74,0x20);
                auVar74 = vpmuludq_avx2(auVar74,auVar52);
                auVar74 = vpsllq_avx2(auVar74,0x20);
                auVar74 = vpaddq_avx2(auVar12,auVar74);
                auVar12 = vpmuludq_avx2(auVar73,auVar52);
                auVar73 = vpsrlq_avx2(auVar73,0x20);
                auVar73 = vpmuludq_avx2(auVar73,auVar52);
                auVar73 = vpsllq_avx2(auVar73,0x20);
                auVar73 = vpaddq_avx2(auVar12,auVar73);
                auVar12 = vpmuludq_avx2(auVar71,auVar52);
                auVar71 = vpsrlq_avx2(auVar71,0x20);
                auVar71 = vpmuludq_avx2(auVar71,auVar52);
                auVar71 = vpsllq_avx2(auVar71,0x20);
                auVar71 = vpaddq_avx2(auVar12,auVar71);
                auVar12 = vpmuludq_avx2(auVar70,auVar52);
                auVar70 = vpsrlq_avx2(auVar70,0x20);
                auVar70 = vpmuludq_avx2(auVar70,auVar52);
                auVar70 = vpsllq_avx2(auVar70,0x20);
                auVar70 = vpaddq_avx2(auVar12,auVar70);
                auVar12 = vpmuludq_avx2(auVar69,auVar52);
                auVar69 = vpsrlq_avx2(auVar69,0x20);
                auVar69 = vpmuludq_avx2(auVar69,auVar52);
                auVar69 = vpsllq_avx2(auVar69,0x20);
                auVar69 = vpaddq_avx2(auVar12,auVar69);
                auVar12 = vpmuludq_avx2(auVar68,auVar52);
                auVar68 = vpsrlq_avx2(auVar68,0x20);
                auVar68 = vpmuludq_avx2(auVar68,auVar52);
                auVar68 = vpsllq_avx2(auVar68,0x20);
                auVar68 = vpaddq_avx2(auVar12,auVar68);
                auVar12 = vpmuludq_avx2(auVar56,auVar52);
                auVar56 = vpsrlq_avx2(auVar56,0x20);
                auVar56 = vpmuludq_avx2(auVar56,auVar52);
                auVar56 = vpsllq_avx2(auVar56,0x20);
                auVar56 = vpaddq_avx2(auVar12,auVar56);
                auVar13 = vpsubq_avx2(local_f8,auVar56);
                auVar14 = vpsubq_avx2(local_f8,auVar68);
                auVar15 = vpsubq_avx2(local_f8,auVar69);
                auVar16 = vpsubq_avx2(local_f8,auVar70);
                auVar65 = vpsubq_avx2(local_f8,auVar65);
                auVar56 = vpcmpgtq_avx2(auVar65,auVar76);
                auVar69 = vblendvpd_avx(auVar76,auVar65,auVar56);
                auVar17 = vpsubq_avx2(local_f8,auVar71);
                auVar56 = vpcmpgtq_avx2(auVar16,auVar76);
                auVar70 = vblendvpd_avx(auVar76,auVar16,auVar56);
                auVar73 = vpsubq_avx2(local_f8,auVar73);
                auVar56 = vpcmpgtq_avx2(auVar14,auVar76);
                auVar68 = vblendvpd_avx(auVar76,auVar14,auVar56);
                auVar74 = vpsubq_avx2(local_f8,auVar74);
                auVar56 = vpcmpgtq_avx2(auVar13,auVar76);
                auVar56 = vblendvpd_avx(auVar76,auVar13,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar78);
                auVar68 = vandpd_avx(auVar68,auVar78);
                auVar71 = vpackusdw_avx2(auVar68,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar15,auVar76);
                auVar56 = vblendvpd_avx(auVar76,auVar15,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar78);
                auVar68 = vandpd_avx(auVar78,auVar70);
                auVar56 = vpackusdw_avx2(auVar56,auVar68);
                auVar68 = vpcmpgtq_avx2(auVar73,auVar76);
                auVar68 = vblendvpd_avx(auVar76,auVar73,auVar68);
                auVar70 = vpermq_avx2(auVar71,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar12 = vpackusdw_avx2(auVar70,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar17,auVar76);
                auVar56 = vblendvpd_avx(auVar76,auVar17,auVar56);
                auVar56 = vandpd_avx(auVar78,auVar56);
                auVar68 = vandpd_avx(auVar68,auVar78);
                auVar70 = vpackusdw_avx2(auVar56,auVar68);
                auVar56 = vpcmpgtq_avx2(auVar74,auVar76);
                auVar56 = vblendvpd_avx(auVar76,auVar74,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar78);
                auVar68 = vandpd_avx(auVar78,auVar69);
                auVar56 = vpackusdw_avx2(auVar56,auVar68);
                auVar68 = vpermq_avx2(auVar70,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar8 = vpackusdw_avx2(auVar68,auVar56);
                auVar13 = vpsubq_avx2(auVar13,auVar53);
                auVar68 = vpsubq_avx2(auVar14,auVar53);
                auVar69 = vpsubq_avx2(auVar65,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar69,auVar76);
                auVar69 = vblendvpd_avx(auVar76,auVar69,auVar56);
                auVar70 = vpsubq_avx2(auVar74,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar70,auVar76);
                auVar70 = vblendvpd_avx(auVar76,auVar70,auVar56);
                auVar71 = vpsubq_avx2(auVar73,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar71,auVar76);
                auVar71 = vblendvpd_avx(auVar76,auVar71,auVar56);
                auVar73 = vpsubq_avx2(auVar17,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar73,auVar76);
                auVar73 = vblendvpd_avx(auVar76,auVar73,auVar56);
                auVar74 = vpsubq_avx2(auVar16,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar74,auVar76);
                auVar74 = vblendvpd_avx(auVar76,auVar74,auVar56);
                auVar65 = vpsubq_avx2(auVar15,auVar53);
                auVar56 = vpcmpgtq_avx2(auVar65,auVar76);
                auVar65 = vblendvpd_avx(auVar76,auVar65,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar68,auVar76);
                auVar68 = vblendvpd_avx(auVar76,auVar68,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar13,auVar76);
                auVar56 = vblendvpd_avx(auVar76,auVar13,auVar56);
                auVar12 = vpermq_avx2(auVar12,0xd8);
                auVar8 = vpermq_avx2(auVar8,0xd8);
                auVar8 = vpackuswb_avx2(auVar12,auVar8);
                auVar72 = ZEXT3264(auVar8);
                auVar56 = vandpd_avx(auVar78,auVar56);
                auVar68 = vandpd_avx(auVar68,auVar78);
                auVar12 = vpackusdw_avx2(auVar68,auVar56);
                auVar56 = vandpd_avx(auVar65,auVar78);
                auVar68 = vandpd_avx(auVar78,auVar74);
                auVar56 = vpackusdw_avx2(auVar56,auVar68);
                auVar68 = vpermq_avx2(auVar12,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar74 = vpackusdw_avx2(auVar68,auVar56);
                auVar56 = vandpd_avx(auVar78,auVar73);
                auVar68 = vandpd_avx(auVar71,auVar78);
                auVar71 = vpackusdw_avx2(auVar56,auVar68);
                auVar56 = vandpd_avx(auVar78,auVar70);
                auVar68 = vandpd_avx(auVar78,auVar69);
                auVar56 = vpackusdw_avx2(auVar56,auVar68);
                auVar68 = vpermq_avx2(auVar71,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar56 = vpackusdw_avx2(auVar68,auVar56);
                alVar18 = (__m256i)vpermq_avx2(auVar8,0xd8);
                *palVar42 = alVar18;
                auVar68 = vpermq_avx2(auVar74,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar56 = vpackuswb_avx2(auVar68,auVar56);
                alVar18 = (__m256i)vpermq_avx2(auVar56,0xd8);
                *palVar43 = alVar18;
                uVar39 = uVar39 + 1;
                palVar43 = palVar43 + 1;
                palVar42 = palVar42 + 1;
              } while (size != uVar39);
              *ptr_01 = '\0';
              lVar44 = (ulong)(uint)s2Len - 1;
              auVar55._8_8_ = lVar44;
              auVar55._0_8_ = lVar44;
              auVar57._16_8_ = lVar44;
              auVar57._0_16_ = auVar55;
              auVar57._24_8_ = lVar44;
              local_138._4_4_ = gap;
              local_138._0_4_ = gap;
              local_138._8_4_ = gap;
              local_138._12_4_ = gap;
              local_138._16_4_ = gap;
              local_138._20_4_ = gap;
              local_138._24_4_ = gap;
              local_138._28_4_ = gap;
              local_158._0_4_ = local_158._4_4_;
              local_158._8_4_ = local_158._4_4_;
              local_158._12_4_ = local_158._4_4_;
              local_158._16_4_ = local_158._4_4_;
              local_158._20_4_ = local_158._4_4_;
              local_158._24_4_ = local_158._4_4_;
              local_158._28_4_ = local_158._4_4_;
              auVar11 = vpmovsxbd_avx2(ZEXT816(0x201f1e1d1c1b1a19));
              local_248._8_8_ = 0x1400000013;
              local_248._0_8_ = 0x1200000011;
              local_248._16_8_ = 0x1600000015;
              local_248._24_8_ = 0x1800000017;
              auVar10 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar9 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar39 = 0;
              auVar75._8_8_ = 0x8000000000000000;
              auVar75._0_8_ = 0x8000000000000000;
              local_178._8_4_ = 0xffffff80;
              local_178._0_8_ = 0xffffff80ffffff80;
              local_178._12_4_ = 0xffffff80;
              local_178._16_4_ = 0xffffff80;
              local_178._20_4_ = 0xffffff80;
              local_178._24_4_ = 0xffffff80;
              local_178._28_4_ = 0xffffff80;
              local_198._8_4_ = 0xff;
              local_198._0_8_ = 0xff000000ff;
              local_198._12_4_ = 0xff;
              local_198._16_4_ = 0xff;
              local_198._20_4_ = 0xff;
              local_198._24_4_ = 0xff;
              local_198._28_4_ = 0xff;
              auVar77._8_4_ = 4;
              auVar77._0_8_ = 0x400000004;
              auVar77._12_4_ = 4;
              auVar79 = ZEXT1664(auVar77);
              local_1f8._8_4_ = 0x20;
              local_1f8._0_8_ = 0x2000000020;
              local_1f8._12_4_ = 0x20;
              local_1f8._16_4_ = 0x20;
              local_1f8._20_4_ = 0x20;
              local_1f8._24_4_ = 0x20;
              local_1f8._28_4_ = 0x20;
              local_1b8._8_8_ = 0x8000000000000000;
              local_1b8._0_8_ = 0x8000000000000000;
              local_1b8._16_8_ = 0x8000000000000000;
              local_1b8._24_8_ = 0x8000000000000000;
              auVar66 = ZEXT1632(auVar77);
              do {
                auVar56._8_8_ = uVar39;
                auVar56._0_8_ = uVar39;
                auVar56._16_8_ = uVar39;
                auVar56._24_8_ = uVar39;
                auVar53 = vpor_avx2(auVar56,_DAT_00908b60);
                auVar67 = vpaddd_avx2(auVar9,_DAT_00909280);
                auVar64 = vpcmpeqd_avx2(auVar72._0_32_,auVar72._0_32_);
                auVar58 = vpaddd_avx2(auVar10,auVar64);
                auVar64 = vpaddd_avx2(auVar64,auVar11);
                auVar52 = vpmulld_avx2(auVar64,local_138);
                auVar58 = vpmulld_avx2(auVar58,local_138);
                auVar67 = vpmulld_avx2(auVar67,local_138);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar53._0_16_,auVar75 ^ auVar55);
                auVar67 = vpsubd_avx2(local_158,auVar67);
                auVar58 = vpsubd_avx2(local_158,auVar58);
                auVar64 = vpcmpeqd_avx2(auVar79._0_32_,auVar79._0_32_);
                auVar58 = vpmaxsd_avx2(auVar58,local_178);
                auVar67 = vpmaxsd_avx2(auVar67,local_178);
                auVar67 = vpand_avx2(local_198,auVar67);
                auVar58 = vpand_avx2(auVar58,local_198);
                auVar67 = vpackusdw_avx2(auVar67,auVar58);
                auVar58 = vpaddd_avx2(auVar64,local_248);
                auVar58 = vpmulld_avx2(auVar58,local_138);
                auVar58 = vpsubd_avx2(local_158,auVar58);
                auVar64 = vpsubd_avx2(local_158,auVar52);
                auVar7 = vpcmpeqd_avx(local_158._0_16_,local_158._0_16_);
                auVar72 = ZEXT1664(auVar7);
                auVar64 = vpmaxsd_avx2(auVar64,local_178);
                auVar58 = vpmaxsd_avx2(auVar58,local_178);
                auVar58 = vpand_avx2(auVar58,local_198);
                auVar64 = vpand_avx2(local_198,auVar64);
                auVar58 = vpackusdw_avx2(auVar58,auVar64);
                auVar67 = vpermq_avx2(auVar67,0xd8);
                auVar58 = vpermq_avx2(auVar58,0xd8);
                auVar67 = vpackuswb_avx2(auVar67,auVar58);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                auVar67 = vpermq_avx2(auVar67,0xd8);
                if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 1] = auVar67[0];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar53._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                auVar79 = ZEXT3264(auVar66);
                if ((auVar77 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 2] = auVar67[1];
                }
                auVar52 = local_1b8 ^ auVar57;
                auVar58 = vpcmpgtq_avx2(local_1b8 ^ auVar53,auVar52);
                auVar64 = vpshuflw_avx2(auVar58,0xe8);
                auVar64 = vpermd_avx2(auVar66,auVar64 ^ _DAT_00909280);
                auVar77 = vpackssdw_avx(auVar64._0_16_,auVar64._0_16_);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 3] = auVar67[2];
                }
                auVar77 = vpackssdw_avx(auVar58._16_16_,auVar58._16_16_);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 4] = auVar67[3];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908c60);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar58,auVar64);
                auVar60._0_2_ = auVar58._16_2_;
                auVar60._2_2_ = auVar60._0_2_;
                auVar60._4_2_ = auVar60._0_2_;
                auVar60._6_2_ = auVar60._0_2_;
                auVar60._8_2_ = auVar60._0_2_;
                auVar60._10_2_ = auVar60._0_2_;
                auVar60._12_2_ = auVar60._0_2_;
                auVar60._14_2_ = auVar60._0_2_;
                auVar77 = vpacksswb_avx(auVar60,auVar60);
                if ((auVar77 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 5] = auVar67[4];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpshufhw_avx(auVar77,0x84);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar58,auVar64);
                auVar61._0_4_ = auVar58._16_4_;
                auVar61._4_4_ = auVar61._0_4_;
                auVar61._8_4_ = auVar61._0_4_;
                auVar61._12_4_ = auVar61._0_4_;
                auVar77 = vpacksswb_avx(auVar61,auVar61);
                if ((auVar77 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 6] = auVar67[5];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpackssdw_avx2(auVar64,auVar64);
                auVar77 = auVar7 ^ auVar58._16_16_;
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 7] = auVar67[6];
                }
                auVar58 = vpshufhw_avx2(auVar64,0x84);
                auVar77 = auVar7 ^ auVar58._16_16_;
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 8] = auVar67[7];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908e20);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpmovzxwd_avx2(auVar77);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar39 + 9] = auVar67[0];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 10] = auVar67[1];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpshuflw_avx2(auVar64,0xe8);
                auVar58 = vpermd_avx2(auVar66,auVar58 ^ _DAT_00909280);
                auVar77 = vpackssdw_avx(auVar58._0_16_,auVar58._0_16_);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0xb] = auVar67[2];
                }
                auVar77 = vpackssdw_avx(auVar64._16_16_,auVar64._16_16_);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar58,auVar58);
                if ((auVar58._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0xc] = auVar67[3];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908e00);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar64,auVar58);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0xd] = auVar67[4];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpshufhw_avx(auVar77,0x84);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar64,auVar58);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0xe] = auVar67[5];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpackssdw_avx2(auVar64,auVar64);
                auVar58 = vpackssdw_avx2(auVar64,auVar58 ^ _DAT_00909280);
                auVar58 = vpacksswb_avx2(auVar58,auVar64);
                if ((auVar58._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0xf] = auVar67[6];
                }
                auVar58 = vpshufhw_avx2(auVar64,0x84);
                auVar58 = vpackssdw_avx2(auVar58 ^ _DAT_00909280,auVar58 ^ _DAT_00909280);
                auVar58 = vpacksswb_avx2(auVar58,auVar58);
                if ((auVar58._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x10] = auVar67[7];
                }
                auVar58 = vpor_avx2(auVar56,_DAT_00908f80);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar58._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x11] = auVar67[0x10];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar58._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x12] = auVar67[0x11];
                }
                auVar58 = vpcmpgtq_avx2(local_1b8 ^ auVar58,auVar52);
                auVar64 = vpshuflw_avx2(auVar58,0xe8);
                auVar64 = vpermd_avx2(auVar66,auVar64 ^ _DAT_00909280);
                auVar77 = vpackssdw_avx(auVar64._0_16_,auVar64._0_16_);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x13] = auVar67[0x12];
                }
                auVar77 = vpackssdw_avx(auVar58._16_16_,auVar58._16_16_);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x14] = auVar67[0x13];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908f60);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar58,auVar64);
                auVar62._0_2_ = auVar58._16_2_;
                auVar62._2_2_ = auVar62._0_2_;
                auVar62._4_2_ = auVar62._0_2_;
                auVar62._6_2_ = auVar62._0_2_;
                auVar62._8_2_ = auVar62._0_2_;
                auVar62._10_2_ = auVar62._0_2_;
                auVar62._12_2_ = auVar62._0_2_;
                auVar62._14_2_ = auVar62._0_2_;
                auVar77 = vpacksswb_avx(auVar62,auVar62);
                if ((auVar77 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x15] = auVar67[0x14];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpshufhw_avx(auVar77,0x84);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar58,auVar64);
                auVar63._0_4_ = auVar58._16_4_;
                auVar63._4_4_ = auVar63._0_4_;
                auVar63._8_4_ = auVar63._0_4_;
                auVar63._12_4_ = auVar63._0_4_;
                auVar77 = vpacksswb_avx(auVar63,auVar63);
                if ((auVar77 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x16] = auVar67[0x15];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpackssdw_avx2(auVar64,auVar64);
                auVar77 = auVar7 ^ auVar58._16_16_;
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x17] = auVar67[0x16];
                }
                auVar58 = vpshufhw_avx2(auVar64,0x84);
                auVar77 = auVar7 ^ auVar58._16_16_;
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar77 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x18] = auVar67[0x17];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908f40);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpmovzxwd_avx2(auVar77);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar39 + 0x19] = auVar67[0x10];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1a] = auVar67[0x11];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpshuflw_avx2(auVar64,0xe8);
                auVar58 = vpermd_avx2(auVar66,auVar58 ^ _DAT_00909280);
                auVar77 = vpackssdw_avx(auVar58._0_16_,auVar58._0_16_);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1b] = auVar67[0x12];
                }
                auVar77 = vpackssdw_avx(auVar64._16_16_,auVar64._16_16_);
                auVar77 = vpackssdw_avx(auVar7 ^ auVar77,auVar7 ^ auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar77),0x55);
                auVar58 = vpacksswb_avx2(auVar58,auVar58);
                if ((auVar58._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1c] = auVar67[0x13];
                }
                auVar64 = vpor_avx2(auVar56,_DAT_00908f20);
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpackssdw_avx(auVar77,auVar77);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar64,auVar58);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1d] = auVar67[0x14];
                }
                auVar77 = vpcmpgtq_avx(auVar75 ^ auVar64._0_16_,auVar75 ^ auVar55);
                auVar77 = vpshufhw_avx(auVar77,0x84);
                auVar58 = vpermq_avx2(ZEXT1632(auVar7 ^ auVar77),0x55);
                auVar58 = vpackssdw_avx2(auVar64,auVar58);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1e] = auVar67[0x15];
                }
                auVar64 = vpcmpgtq_avx2(local_1b8 ^ auVar64,auVar52);
                auVar58 = vpackssdw_avx2(auVar64,auVar64);
                auVar58 = vpackssdw_avx2(auVar64,auVar58 ^ _DAT_00909280);
                auVar58 = vpacksswb_avx2(auVar64,auVar58);
                if ((auVar58._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x1f] = auVar67[0x16];
                }
                auVar58 = vpshufhw_avx2(auVar64,0x84);
                auVar58 = vpackssdw_avx2(auVar58 ^ _DAT_00909280,auVar58 ^ _DAT_00909280);
                auVar58 = vpacksswb_avx2(auVar58,auVar58);
                if ((auVar58._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar39 + 0x20] = auVar67[0x17];
                }
                uVar39 = uVar39 + 0x20;
                auVar9 = vpaddd_avx2(auVar9,local_1f8);
                auVar10 = vpaddd_avx2(auVar10,local_1f8);
                local_248 = vpaddd_avx2(local_248,local_1f8);
                auVar11 = vpaddd_avx2(auVar11,local_1f8);
              } while ((s2Len + 0x1fU & 0xffffffe0) != uVar39);
              iVar38 = (int)size;
              lVar44 = size * 0x20;
              uVar39 = 0;
              auVar11[1] = cVar46;
              auVar11[0] = cVar46;
              auVar11[2] = cVar46;
              auVar11[3] = cVar46;
              auVar11[4] = cVar46;
              auVar11[5] = cVar46;
              auVar11[6] = cVar46;
              auVar11[7] = cVar46;
              auVar11[8] = cVar46;
              auVar11[9] = cVar46;
              auVar11[10] = cVar46;
              auVar11[0xb] = cVar46;
              auVar11[0xc] = cVar46;
              auVar11[0xd] = cVar46;
              auVar11[0xe] = cVar46;
              auVar11[0xf] = cVar46;
              auVar11[0x10] = cVar46;
              auVar11[0x11] = cVar46;
              auVar11[0x12] = cVar46;
              auVar11[0x13] = cVar46;
              auVar11[0x14] = cVar46;
              auVar11[0x15] = cVar46;
              auVar11[0x16] = cVar46;
              auVar11[0x17] = cVar46;
              auVar11[0x18] = cVar46;
              auVar11[0x19] = cVar46;
              auVar11[0x1a] = cVar46;
              auVar11[0x1b] = cVar46;
              auVar11[0x1c] = cVar46;
              auVar11[0x1d] = cVar46;
              auVar11[0x1e] = cVar46;
              auVar11[0x1f] = cVar46;
              auVar72 = ZEXT3264(auVar11);
              auVar10[1] = cVar49;
              auVar10[0] = cVar49;
              auVar10[2] = cVar49;
              auVar10[3] = cVar49;
              auVar10[4] = cVar49;
              auVar10[5] = cVar49;
              auVar10[6] = cVar49;
              auVar10[7] = cVar49;
              auVar10[8] = cVar49;
              auVar10[9] = cVar49;
              auVar10[10] = cVar49;
              auVar10[0xb] = cVar49;
              auVar10[0xc] = cVar49;
              auVar10[0xd] = cVar49;
              auVar10[0xe] = cVar49;
              auVar10[0xf] = cVar49;
              auVar10[0x10] = cVar49;
              auVar10[0x11] = cVar49;
              auVar10[0x12] = cVar49;
              auVar10[0x13] = cVar49;
              auVar10[0x14] = cVar49;
              auVar10[0x15] = cVar49;
              auVar10[0x16] = cVar49;
              auVar10[0x17] = cVar49;
              auVar10[0x18] = cVar49;
              auVar10[0x19] = cVar49;
              auVar10[0x1a] = cVar49;
              auVar10[0x1b] = cVar49;
              auVar10[0x1c] = cVar49;
              auVar10[0x1d] = cVar49;
              auVar10[0x1e] = cVar49;
              auVar10[0x1f] = cVar49;
              auVar79 = ZEXT3264(auVar10);
              auVar9[1] = uVar50;
              auVar9[0] = uVar50;
              auVar9[2] = uVar50;
              auVar9[3] = uVar50;
              auVar9[4] = uVar50;
              auVar9[5] = uVar50;
              auVar9[6] = uVar50;
              auVar9[7] = uVar50;
              auVar9[8] = uVar50;
              auVar9[9] = uVar50;
              auVar9[10] = uVar50;
              auVar9[0xb] = uVar50;
              auVar9[0xc] = uVar50;
              auVar9[0xd] = uVar50;
              auVar9[0xe] = uVar50;
              auVar9[0xf] = uVar50;
              auVar9[0x10] = uVar50;
              auVar9[0x11] = uVar50;
              auVar9[0x12] = uVar50;
              auVar9[0x13] = uVar50;
              auVar9[0x14] = uVar50;
              auVar9[0x15] = uVar50;
              auVar9[0x16] = uVar50;
              auVar9[0x17] = uVar50;
              auVar9[0x18] = uVar50;
              auVar9[0x19] = uVar50;
              auVar9[0x1a] = uVar50;
              auVar9[0x1b] = uVar50;
              auVar9[0x1c] = uVar50;
              auVar9[0x1d] = uVar50;
              auVar9[0x1e] = uVar50;
              auVar9[0x1f] = uVar50;
              do {
                palVar42 = ptr;
                ptr = palVar36;
                auVar55 = SUB3216(palVar42[iVar38 - 1],0);
                auVar66._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar72._0_16_;
                auVar66._16_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar55;
                auVar57 = vpalignr_avx2((undefined1  [32])palVar42[iVar38 - 1],auVar66,0xf);
                iVar45 = ppVar4->mapper[(byte)s2[uVar39]];
                auVar55 = vpinsrb_avx(auVar57._0_16_,(uint)(byte)ptr_01[uVar39],0);
                auVar57 = vpblendd_avx2(auVar57,ZEXT1632(auVar55),0xf);
                lVar41 = 0;
                auVar59 = ZEXT3264(auVar11);
                do {
                  auVar66 = vpaddsb_avx2(auVar57,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar41 + size * (long)iVar45 * 0x20));
                  auVar57 = *(undefined1 (*) [32])((long)*ptr_00 + lVar41);
                  auVar58 = auVar59._0_32_;
                  auVar67 = vpmaxsb_avx2(auVar57,auVar58);
                  auVar66 = vpmaxsb_avx2(auVar66,auVar67);
                  *(undefined1 (*) [32])((long)*ptr + lVar41) = auVar66;
                  auVar67 = vpmaxsb_avx2(auVar72._0_32_,auVar66);
                  auVar72 = ZEXT3264(auVar67);
                  auVar67 = vpminsb_avx2(auVar79._0_32_,auVar57);
                  auVar67 = vpminsb_avx2(auVar67,auVar58);
                  auVar67 = vpminsb_avx2(auVar67,auVar66);
                  auVar79 = ZEXT3264(auVar67);
                  auVar66 = vpsubsb_avx2(auVar66,auVar9);
                  auVar57 = vpsubsb_avx2(auVar57,auVar54);
                  auVar57 = vpmaxsb_avx2(auVar57,auVar66);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar41) = auVar57;
                  auVar57 = vpsubsb_avx2(auVar58,auVar54);
                  auVar57 = vpmaxsb_avx2(auVar57,auVar66);
                  auVar59 = ZEXT3264(auVar57);
                  auVar57 = *(undefined1 (*) [32])((long)*palVar42 + lVar41);
                  lVar41 = lVar41 + 0x20;
                } while (lVar44 != lVar41);
                iVar45 = 0;
                do {
                  iVar40 = ptr_01[uVar39 + 1] - open;
                  if (iVar40 < -0x7f) {
                    iVar40 = -0x80;
                  }
                  auVar67._0_16_ = ZEXT116(0) * auVar59._0_16_ + ZEXT116(1) * auVar72._0_16_;
                  auVar67._16_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar59._0_16_;
                  auVar57 = vpalignr_avx2(auVar59._0_32_,auVar67,0xf);
                  auVar55 = vpinsrb_avx(auVar57._0_16_,iVar40,0);
                  auVar57 = vpblendd_avx2(auVar57,ZEXT1632(auVar55),0xf);
                  auVar59 = ZEXT3264(auVar57);
                  lVar41 = 0;
                  do {
                    auVar57 = vpmaxsb_avx2(auVar59._0_32_,
                                           *(undefined1 (*) [32])((long)*ptr + lVar41));
                    *(undefined1 (*) [32])((long)*ptr + lVar41) = auVar57;
                    auVar67 = vpminsb_avx2(auVar79._0_32_,auVar57);
                    auVar79 = ZEXT3264(auVar67);
                    auVar66 = vpmaxsb_avx2(auVar72._0_32_,auVar57);
                    auVar72 = ZEXT3264(auVar66);
                    auVar57 = vpsubsb_avx2(auVar57,auVar9);
                    auVar58 = vpsubsb_avx2(auVar59._0_32_,auVar54);
                    auVar59 = ZEXT3264(auVar58);
                    auVar57 = vpcmpgtb_avx2(auVar58,auVar57);
                    if ((((((((((((((((((((((((((((((((auVar57 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar57 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar57 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar57 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar57 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar57 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar57 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar57 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar57 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar57 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar57 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar57 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar57 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar57 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar57 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar57 >> 0x7f,0) == '\0')
                                      && (auVar57 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar57 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar57 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar57 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar57 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar57 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar57 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar57 >> 0xbf,0) == '\0') &&
                              (auVar57 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar57 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar57 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar57 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar57 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar57 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar57 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar57[0x1f]) goto LAB_0082126a;
                    lVar41 = lVar41 + 0x20;
                  } while (lVar44 != lVar41);
                  iVar45 = iVar45 + 1;
                } while (iVar45 != 0x20);
LAB_0082126a:
                alVar18 = ptr[uVar6];
                cVar49 = alVar18[2]._7_1_;
                if (iVar34 < 0x1f) {
                  iVar45 = 0;
                  do {
                    auVar57 = vperm2i128_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar18,
                                              0x28);
                    alVar18 = (__m256i)vpalignr_avx2((undefined1  [32])alVar18,auVar57,0xf);
                    cVar49 = alVar18[2]._7_1_;
                    iVar45 = iVar45 + 1;
                  } while (iVar45 < 0x1f - iVar34);
                }
                ((ppVar35->field_4).rowcols)->score_row[uVar39] = (int)cVar49;
                uVar39 = uVar39 + 1;
                palVar36 = palVar42;
                if (uVar39 == (uint)s2Len) {
                  uVar39 = (ulong)(uint)(iVar38 * 4);
                  uVar48 = 0;
                  do {
                    piVar5 = ((ppVar35->field_4).rowcols)->score_col;
                    plVar1 = *ptr + uVar48;
                    lVar31 = *plVar1;
                    cVar49 = *(char *)((long)plVar1 + 1);
                    cVar46 = *(char *)((long)plVar1 + 2);
                    cVar19 = *(char *)((long)plVar1 + 3);
                    cVar20 = *(char *)((long)plVar1 + 4);
                    cVar21 = *(char *)((long)plVar1 + 5);
                    cVar22 = *(char *)((long)plVar1 + 6);
                    cVar23 = *(char *)((long)plVar1 + 7);
                    plVar1 = *ptr + uVar48 + 2;
                    lVar32 = *plVar1;
                    cVar24 = *(char *)((long)plVar1 + 1);
                    cVar25 = *(char *)((long)plVar1 + 2);
                    cVar26 = *(char *)((long)plVar1 + 3);
                    cVar27 = *(char *)((long)plVar1 + 4);
                    cVar28 = *(char *)((long)plVar1 + 5);
                    cVar29 = *(char *)((long)plVar1 + 6);
                    cVar30 = *(char *)((long)plVar1 + 7);
                    *(int *)((long)piVar5 + uVar48) = (int)(char)lVar31;
                    *(int *)((long)piVar5 + uVar39 + uVar48) = (int)cVar49;
                    *(int *)((long)piVar5 + (uint)(iVar38 * 8) + uVar48) = (int)cVar46;
                    *(int *)((long)piVar5 + uVar39 * 3 + uVar48) = (int)cVar19;
                    *(int *)((long)piVar5 + (uint)(iVar38 << 4) + uVar48) = (int)cVar20;
                    *(int *)((long)piVar5 + uVar39 * 5 + uVar48) = (int)cVar21;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 * 8) * 3 + uVar48) = (int)cVar22;
                    *(int *)((long)piVar5 + size * 0x1c + uVar48) = (int)cVar23;
                    *(int *)((long)piVar5 + lVar44 + uVar48) = (int)(char)lVar31;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 * 4) * 9 + uVar48) = (int)cVar49;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 * 8) * 5 + uVar48) = (int)cVar46;
                    *(int *)((long)piVar5 + size * 0x2c + uVar48) = (int)cVar19;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 << 4) * 3 + uVar48) = (int)cVar20;
                    *(int *)((long)piVar5 + size * 0x34 + uVar48) = (int)cVar21;
                    *(int *)((long)piVar5 + size * 0x38 + uVar48) = (int)cVar22;
                    *(int *)((long)piVar5 + size * 0x3c + uVar48) = (int)cVar23;
                    *(int *)((long)piVar5 + size * 0x40 + uVar48) = (int)(char)lVar32;
                    *(int *)((long)piVar5 + size * 0x40 + (ulong)(uint)(iVar38 * 4) + uVar48) =
                         (int)cVar24;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 * 8) * 9 + uVar48) = (int)cVar25;
                    *(int *)((long)piVar5 + size * 0x4c + uVar48) = (int)cVar26;
                    *(int *)((long)piVar5 + (ulong)(uint)(iVar38 << 4) * 5 + uVar48) = (int)cVar27;
                    *(int *)((long)piVar5 + size * 0x54 + uVar48) = (int)cVar28;
                    *(int *)((long)piVar5 + size * 0x58 + uVar48) = (int)cVar29;
                    *(int *)((long)piVar5 + size * 0x5c + uVar48) = (int)cVar30;
                    *(int *)((long)piVar5 + size * 0x60 + uVar48) = (int)(char)lVar32;
                    *(int *)((long)piVar5 + size * 100 + uVar48) = (int)cVar24;
                    *(int *)((long)piVar5 + size * 0x68 + uVar48) = (int)cVar25;
                    *(int *)((long)piVar5 + size * 0x6c + uVar48) = (int)cVar26;
                    *(int *)((long)piVar5 + size * 0x70 + uVar48) = (int)cVar27;
                    *(int *)((long)piVar5 + size * 0x74 + uVar48) = (int)cVar28;
                    *(int *)((long)piVar5 + size * 0x78 + uVar48) = (int)cVar29;
                    *(int *)((long)piVar5 + size * 0x7c + uVar48) = (int)cVar30;
                    uVar48 = uVar48 + 4;
                  } while (uVar39 != uVar48);
                  alVar18 = ptr[uVar6];
                  cVar49 = alVar18[2]._7_1_;
                  if (iVar34 < 0x1f) {
                    iVar38 = 0;
                    do {
                      auVar9 = vperm2i128_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar18,
                                               0x28);
                      alVar18 = (__m256i)vpalignr_avx2((undefined1  [32])alVar18,auVar9,0xf);
                      cVar49 = alVar18[2]._7_1_;
                      iVar38 = iVar38 + 1;
                    } while (iVar38 < 0x1f - iVar34);
                  }
                  auVar9 = vpcmpgtb_avx2(auVar11,auVar67);
                  auVar10 = vpcmpgtb_avx2(auVar66,auVar10);
                  auVar9 = vpor_avx2(auVar10,auVar9);
                  if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar9 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar9 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar9 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar9 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar9 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar9 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar9 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar9 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar9 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar9 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar9 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar9 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar9 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar9 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar9 >> 0x7f,0) != '\0') ||
                                    (auVar9 >> 0x87 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar9 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar9 >> 0x97 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar9 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar9 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar9 >> 0xaf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar9 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar9 >> 0xbf,0) != '\0') ||
                            (auVar9 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar9 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar9 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar9 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar9 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar9[0x1f] < '\0') {
                    *(byte *)&ppVar35->flag = (byte)ppVar35->flag | 0x40;
                    cVar49 = '\0';
                    iVar37 = 0;
                    uVar33 = 0;
                  }
                  ppVar35->score = (int)cVar49;
                  ppVar35->end_query = uVar33;
                  ppVar35->end_ref = iVar37;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar42);
                  parasail_free(ptr);
                  return ppVar35;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}